

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

int validate_pcp_msg(pcp_recv_msg_t *f)

{
  char *pcVar1;
  pcp_response_t *resp;
  pcp_recv_msg_t *f_local;
  
  if ((((f->pcp_msg_len & 3) == 0) && (3 < f->pcp_msg_len)) && (f->pcp_msg_len < 0x44d)) {
    pcVar1 = f->pcp_msg_buffer;
    if ((*pcVar1 == '\0') || ((f->pcp_msg_buffer[1] & 0x80U) != 0)) {
      if ((byte)*pcVar1 < 3) {
        f_local._4_4_ = 1;
      }
      else {
        pcp_logger(PCP_LOGLVL_WARN,"Received PCP msg using unsupported PCP version %d",
                   (ulong)(byte)*pcVar1);
        f_local._4_4_ = 0;
      }
    }
    else {
      pcp_logger(PCP_LOGLVL_WARN,"%s","Received packet without response bit set");
      f_local._4_4_ = 0;
    }
  }
  else {
    pcp_logger(PCP_LOGLVL_WARN,"Received packet with invalid size %d)",(ulong)f->pcp_msg_len);
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

int validate_pcp_msg(pcp_recv_msg_t *f) {
    pcp_response_t *resp;

    // check size
    if (((f->pcp_msg_len & 3) != 0) || (f->pcp_msg_len < 4) ||
        (f->pcp_msg_len > PCP_MAX_LEN)) {
        PCP_LOG(PCP_LOGLVL_WARN, "Received packet with invalid size %d)",
                f->pcp_msg_len);
        return 0;
    }

    resp = (pcp_response_t *)f->pcp_msg_buffer;
    if ((resp->ver) && !(resp->r_opcode & 0x80)) {
        PCP_LOG(PCP_LOGLVL_WARN, "%s",
                "Received packet without response bit set");
        return 0;
    }

    if (resp->ver > PCP_MAX_SUPPORTED_VERSION) {
        PCP_LOG(PCP_LOGLVL_WARN,
                "Received PCP msg using unsupported PCP version %d", resp->ver);
        return 0;
    }

    return 1;
}